

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeNVT.cpp
# Opt level: O2

void __thiscall OpenMD::FluctuatingChargeNVT::initialize(FluctuatingChargeNVT *this)

{
  double dVar1;
  Globals *pGVar2;
  FluctuatingChargeParameters *pFVar3;
  pair<double,_double> local_28;
  
  FluctuatingChargePropagator::initialize(&this->super_FluctuatingChargePropagator);
  if ((this->super_FluctuatingChargePropagator).hasFlucQ_ == true) {
    pGVar2 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    if ((pGVar2->Dt).super_ParameterBase.empty_ == false) {
      dVar1 = (pGVar2->Dt).data_;
      this->dt_ = dVar1;
      this->dt2_ = dVar1 * 0.5;
    }
    else {
      builtin_strncpy(painCave.errMsg + 0x20,"s not set\n",0xb);
      builtin_strncpy(painCave.errMsg + 0x10,"eNVT Error: dt i",0x10);
      builtin_strncpy(painCave.errMsg,"FluctuatingCharg",0x10);
      painCave.isFatal = 1;
      simError();
      pGVar2 = ((this->super_FluctuatingChargePropagator).info_)->simParams_;
    }
    if ((pGVar2->UseIntialExtendedSystemState).super_ParameterBase.field_0x2b == '\0') {
      local_28.first = 0.0;
      local_28.second = 0.0;
      Snapshot::setElectronicThermostat(this->snap,&local_28);
    }
    pFVar3 = (this->super_FluctuatingChargePropagator).fqParams_;
    if ((pFVar3->TargetTemp).super_ParameterBase.empty_ == true) {
      memcpy(&painCave,
             "You can\'t use the FluctuatingChargeNVT propagator without a flucQ.targetTemp!\n",0x4f
            );
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      pFVar3 = (this->super_FluctuatingChargePropagator).fqParams_;
    }
    else {
      this->targetTemp_ = (pFVar3->TargetTemp).data_;
    }
    if ((pFVar3->TauThermostat).super_ParameterBase.empty_ == true) {
      memcpy(&painCave,
             "If you use the FluctuatingChargeNVT\n\tpropagator, you must set flucQ.tauThermostat .\n"
             ,0x55);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      this->tauThermostat_ = (pFVar3->TauThermostat).data_;
    }
    (*(this->super_FluctuatingChargePropagator)._vptr_FluctuatingChargePropagator[3])(this);
  }
  return;
}

Assistant:

void FluctuatingChargeNVT::initialize() {
    FluctuatingChargePropagator::initialize();
    if (hasFlucQ_) {
      if (info_->getSimParams()->haveDt()) {
        dt_  = info_->getSimParams()->getDt();
        dt2_ = dt_ * 0.5;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "FluctuatingChargeNVT Error: dt is not set\n");
        painCave.isFatal = 1;
        simError();
      }

      if (!info_->getSimParams()->getUseIntialExtendedSystemState()) {
        snap->setElectronicThermostat(make_pair(0.0, 0.0));
      }

      if (!fqParams_->haveTargetTemp()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "You can't use the FluctuatingChargeNVT "
                 "propagator without a flucQ.targetTemp!\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      } else {
        targetTemp_ = fqParams_->getTargetTemp();
      }

      // We must set tauThermostat.

      if (!fqParams_->haveTauThermostat()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "If you use the FluctuatingChargeNVT\n"
                 "\tpropagator, you must set flucQ.tauThermostat .\n");

        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      } else {
        tauThermostat_ = fqParams_->getTauThermostat();
      }
      updateSizes();
    }
  }